

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O1

EStatusCode __thiscall
PDFHummus::DocumentContext::EndFormXObjectNoRelease
          (DocumentContext *this,PDFFormXObject *inFormXObject)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  ObjectsContext *pOVar3;
  EStatusCode EVar4;
  PDFStream *inStream;
  ObjectIDType inObjectID;
  ResourcesDictionary *inResourcesDictionary;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  iterator __position;
  iterator __position_00;
  
  pOVar3 = this->mObjectsContext;
  inStream = PDFFormXObject::GetContentStream(inFormXObject);
  EVar4 = ObjectsContext::EndPDFStream(pOVar3,inStream);
  if (EVar4 == eSuccess) {
    pOVar3 = this->mObjectsContext;
    inObjectID = PDFFormXObject::GetResourcesDictionaryObjectID(inFormXObject);
    EVar4 = ObjectsContext::StartNewIndirectObject(pOVar3,inObjectID);
    if (EVar4 == eSuccess) {
      inResourcesDictionary = PDFFormXObject::GetResourcesDictionary(inFormXObject);
      WriteResourcesDictionary(this,inResourcesDictionary);
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
      p_Var2 = &(this->mFormEndTasks)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (this->mFormEndTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var2->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[*(PDFFormXObject **)(p_Var6 + 1) < inFormXObject]) {
        if (*(PDFFormXObject **)(p_Var6 + 1) >= inFormXObject) {
          p_Var5 = p_Var6;
        }
      }
      __position._M_node = &p_Var2->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
         (__position._M_node = p_Var5, inFormXObject < *(PDFFormXObject **)(p_Var5 + 1))) {
        __position._M_node = &p_Var2->_M_header;
      }
      if ((_Rb_tree_header *)__position._M_node == p_Var2) {
        EVar4 = eSuccess;
      }
      else {
        pp_Var1 = &__position._M_node[1]._M_parent;
        p_Var6 = __position._M_node[1]._M_parent;
        if (p_Var6 == (_Base_ptr)pp_Var1) {
          EVar4 = eSuccess;
        }
        else {
          do {
            EVar4 = (**(code **)(*(long *)p_Var6->_M_left + 0x10))
                              (p_Var6->_M_left,inFormXObject,this->mObjectsContext,this);
            if (EVar4 != eSuccess) break;
            p_Var6 = *(_Base_ptr *)p_Var6;
          } while (p_Var6 != (_Base_ptr)pp_Var1);
        }
        for (p_Var6 = *pp_Var1; p_Var6 != (_Base_ptr)pp_Var1; p_Var6 = *(_Base_ptr *)p_Var6) {
          if (p_Var6->_M_left != (_Base_ptr)0x0) {
            (**(code **)(*(long *)p_Var6->_M_left + 8))();
          }
        }
        std::
        _Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
        ::erase_abi_cxx11_((_Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
                            *)&this->mFormEndTasks,__position);
      }
      if (EVar4 == eSuccess) {
        p_Var2 = &(this->mMoreFormEndTasks)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (this->mMoreFormEndTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var2->_M_header;
        for (; p_Var6 != (_Base_ptr)0x0;
            p_Var6 = (&p_Var6->_M_left)[*(PDFFormXObject **)(p_Var6 + 1) < inFormXObject]) {
          if (*(PDFFormXObject **)(p_Var6 + 1) >= inFormXObject) {
            p_Var5 = p_Var6;
          }
        }
        __position_00._M_node = &p_Var2->_M_header;
        if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
           (__position_00._M_node = p_Var5, inFormXObject < *(PDFFormXObject **)(p_Var5 + 1))) {
          __position_00._M_node = &p_Var2->_M_header;
        }
        if ((_Rb_tree_header *)__position_00._M_node == p_Var2) {
          EVar4 = eSuccess;
        }
        else {
          pp_Var1 = &__position_00._M_node[1]._M_parent;
          p_Var6 = __position_00._M_node[1]._M_parent;
          if (p_Var6 == (_Base_ptr)pp_Var1) {
            EVar4 = eSuccess;
          }
          else {
            do {
              EVar4 = (**(code **)(*(long *)p_Var6->_M_left + 0x10))
                                (p_Var6->_M_left,this->mObjectsContext,this);
              if (EVar4 != eSuccess) break;
              p_Var6 = *(_Base_ptr *)p_Var6;
            } while (p_Var6 != (_Base_ptr)pp_Var1);
          }
          for (p_Var6 = *pp_Var1; p_Var6 != (_Base_ptr)pp_Var1; p_Var6 = *(_Base_ptr *)p_Var6) {
            if (p_Var6->_M_left != (_Base_ptr)0x0) {
              (**(code **)(*(long *)p_Var6->_M_left + 8))();
            }
          }
          std::
          _Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
          ::erase_abi_cxx11_((_Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
                              *)&this->mMoreFormEndTasks,__position_00);
        }
      }
    }
  }
  return EVar4;
}

Assistant:

EStatusCode DocumentContext::EndFormXObjectNoRelease(PDFFormXObject* inFormXObject)
{
	EStatusCode status = mObjectsContext->EndPDFStream(inFormXObject->GetContentStream());
	if(status != eSuccess)
		return status;

	// now write the resources dictionary, full of all the goodness that got accumulated over the stream write
	status = mObjectsContext->StartNewIndirectObject(inFormXObject->GetResourcesDictionaryObjectID());
	if(status != eSuccess)
		return status;
	WriteResourcesDictionary(inFormXObject->GetResourcesDictionary());
	mObjectsContext->EndIndirectObject();

    // now write writing tasks
	{
		PDFFormXObjectToIFormEndWritingTaskListMap::iterator it= mFormEndTasks.find(inFormXObject);

		if(it != mFormEndTasks.end())
		{
			IFormEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(inFormXObject,mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mFormEndTasks.erase(it);
		}

	}
	if(status != eSuccess)
		return status;


	// and more writing tasks
	{
		PDFFormXObjectToIObjectEndWritingTaskListMap::iterator it= mMoreFormEndTasks.find(inFormXObject);

		if(it != mMoreFormEndTasks.end())
		{
			IObjectEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mMoreFormEndTasks.erase(it);
		}		
	}

	return status;
}